

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O2

BasicHeapType __thiscall
wasm::anon_unknown_24::HeapTypeGeneratorImpl::generateBasicHeapType
          (HeapTypeGeneratorImpl *this,Shareability share)

{
  bool bVar1;
  BasicHeapType BVar2;
  value_type *pvVar3;
  initializer_list<wasm::HeapType> __l;
  HeapType HStack_78;
  value_type ht;
  undefined1 local_38 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> options;
  
  bVar1 = Random::oneIn(this->rand,0x10);
  if (bVar1) {
    BVar2 = Random::
            pick<wasm::HeapType::BasicHeapType,wasm::HeapType::BasicHeapType,wasm::HeapType::BasicHeapType>
                      (this->rand,noext,nofunc,none);
    HStack_78.id = (uintptr_t)BVar2;
    BVar2 = HeapType::getBasic(&HStack_78,share);
  }
  else {
    HStack_78.id = 0x10;
    ht.id = 8;
    __l._M_len = 7;
    __l._M_array = &HStack_78;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_38,__l,
               (allocator_type *)
               ((long)&options.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    if ((share == Unshared) && (((this->features).features & 0x40) != 0)) {
      HStack_78.id = 0x48;
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::emplace_back<wasm::HeapType>
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_38,&HStack_78);
    }
    pvVar3 = Random::pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                       (this->rand,
                        (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_38);
    HStack_78.id = pvVar3->id;
    if (share == Unshared) {
      if ((HStack_78.id != 0x48 & *(byte *)((long)&(this->features).features + 2) >> 1) == 1) {
        bVar1 = Random::oneIn(this->rand,2);
        share = (Shareability)!bVar1;
      }
      else {
        share = Unshared;
      }
    }
    BVar2 = HeapType::getBasic(&HStack_78,share);
    std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
              ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_38);
  }
  return BVar2;
}

Assistant:

HeapType::BasicHeapType generateBasicHeapType(Shareability share) {
    // Choose bottom types more rarely.
    // TODO: string and cont types
    if (rand.oneIn(16)) {
      HeapType ht =
        rand.pick(HeapType::noext, HeapType::nofunc, HeapType::none);
      return ht.getBasic(share);
    }

    std::vector<HeapType> options{HeapType::func,
                                  HeapType::ext,
                                  HeapType::any,
                                  HeapType::eq,
                                  HeapType::i31,
                                  HeapType::struct_,
                                  HeapType::array};
    // Avoid shared exn, which we cannot generate.
    if (features.hasExceptionHandling() && share == Unshared) {
      options.push_back(HeapType::exn);
    }
    auto ht = rand.pick(options);
    if (share == Unshared && features.hasSharedEverything() &&
        ht != HeapType::exn && rand.oneIn(2)) {
      share = Shared;
    }
    return ht.getBasic(share);
  }